

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvrm.c
# Opt level: O0

int nvrm_get_chipset(gpu_object *obj)

{
  gpu_object *dev_00;
  nvrm_device *pnVar1;
  gpu_object *dev;
  gpu_object *obj_local;
  
  dev_00 = nvrm_get_device(obj);
  if ((dev_00 == (gpu_object *)0x0) || (dev_00->class_data == (void *)0x0)) {
    if (chipset == 0) {
      fprintf(_stdout,
              "ERROR: Can\'t detect chipset, you need to use -m option or regenerate trace with newer mmt (> Sep 7 2014)%s\n"
              ,"");
      if (mmt_sync_fd != -1) {
        fflush(_stdout);
      }
      demmt_abort();
    }
    nvrm_device_set_chipset(dev_00,chipset);
    obj_local._4_4_ = nvrm_get_chipset(obj);
  }
  else {
    pnVar1 = nvrm_dev(dev_00);
    obj_local._4_4_ = pnVar1->chipset;
  }
  return obj_local._4_4_;
}

Assistant:

int nvrm_get_chipset(struct gpu_object *obj)
{
	struct gpu_object *dev = nvrm_get_device(obj);

	if (dev && dev->class_data)
		return nvrm_dev(dev)->chipset;

	if (chipset) {
		nvrm_device_set_chipset(dev, chipset);
		return nvrm_get_chipset(obj);
	}

	mmt_error("Can't detect chipset, you need to use -m option or regenerate trace with newer mmt (> Sep 7 2014)%s\n", "");
	demmt_abort();
}